

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::internal::UnknownFieldParserHelper>
                 (UnknownFieldParserHelper *field_parser,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint local_2c;
  ParseContext *pPStack_28;
  uint32_t tag;
  ParseContext *ctx_local;
  char *ptr_local;
  UnknownFieldParserHelper *field_parser_local;
  
  pPStack_28 = ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)field_parser;
  while( true ) {
    bVar1 = ParseContext::Done(pPStack_28,(char **)&ctx_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)ReadTag((char *)ctx_local,&local_2c,0);
    if (ctx_local == (ParseContext *)0x0) break;
    if ((local_2c == 0) || ((local_2c & 7) == 4)) {
      EpsCopyInputStream::SetLastTag(&pPStack_28->super_EpsCopyInputStream,local_2c);
      return (char *)ctx_local;
    }
    ctx_local = (ParseContext *)
                FieldParser<google::protobuf::internal::UnknownFieldParserHelper>
                          ((ulong)local_2c,(UnknownFieldParserHelper *)ptr_local,(char *)ctx_local,
                           pPStack_28);
    if (ctx_local == (ParseContext *)0x0) {
      return (char *)0x0;
    }
  }
  return (char *)0x0;
}

Assistant:

[[nodiscard]] const char* WireFormatParser(T& field_parser, const char* ptr,
                                           ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}